

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestcompareArray::runTestCase(TestValueTestcompareArray *this)

{
  Value *in_RDI;
  PredicateContext _minitest_Context_6;
  PredicateContext _minitest_Context_5;
  PredicateContext _minitest_Context_4;
  PredicateContext _minitest_Context_3;
  PredicateContext _minitest_Context_2;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  Value l2bArray;
  Value l2aArray;
  Value l1bArray;
  Value l1aArray;
  Value emptyArray;
  Int in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc68;
  ValueType in_stack_fffffffffffffc6c;
  ValueTest *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffc94;
  Value *in_stack_fffffffffffffca8;
  Value *in_stack_fffffffffffffcb0;
  Value *in_stack_fffffffffffffcd8;
  Value *in_stack_fffffffffffffce0;
  undefined4 local_318 [2];
  char *local_310;
  undefined4 local_308;
  char *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined4 local_2c0 [2];
  char *local_2b8;
  undefined4 local_2b0;
  char *local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 local_290 [2];
  char *local_288;
  undefined4 local_280;
  char *local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined4 local_260 [2];
  char *local_258;
  undefined4 local_250;
  char *local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined4 local_230 [2];
  char *local_228;
  undefined4 local_220;
  char *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined4 local_200 [2];
  char *local_1f8;
  undefined4 local_1f0;
  char *local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  Json::Value::Value(in_RDI,in_stack_fffffffffffffc5c);
  Json::Value::append(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  Json::Value::Value(in_RDI,in_stack_fffffffffffffc5c);
  Json::Value::append(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  Json::Value::Value(in_RDI,in_stack_fffffffffffffc5c);
  Json::Value::append(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  Json::Value::Value(in_RDI,in_stack_fffffffffffffc5c);
  Json::Value::append(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  Json::Value::Value(in_RDI,in_stack_fffffffffffffc5c);
  Json::Value::append(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  Json::Value::Value(in_RDI,in_stack_fffffffffffffc5c);
  Json::Value::append(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  local_200[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1f0 = 0x588;
  local_1e8 = "checkIsLess(emptyArray, l1aArray)";
  local_1e0 = 0;
  local_1d8 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_200;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_200;
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_230[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_220 = 0x589;
  local_218 = "checkIsLess(emptyArray, l2aArray)";
  local_210 = 0;
  local_208 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_230;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_230;
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_260[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_250 = 0x58a;
  local_248 = "checkIsLess(l1aArray, l2aArray)";
  local_240 = 0;
  local_238 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_260;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_260;
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_290[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_280 = 0x58b;
  local_278 = "checkIsLess(l2aArray, l2bArray)";
  local_270 = 0;
  local_268 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_290;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_290;
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_2c0[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b0 = 0x58c;
  local_2a8 = "checkIsEqual(emptyArray, Json::Value(emptyArray))";
  local_2a0 = 0;
  local_298 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_2c0;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_2c0;
  Json::Value::Value(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  ValueTest::checkIsEqual
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_318[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_308 = 0x58d;
  local_300 = "checkIsEqual(l1aArray, Json::Value(l1aArray))";
  local_2f8 = 0;
  local_2f0 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_318;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_318;
  Json::Value::Value(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  ValueTest::checkIsEqual
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  uVar1 = **(undefined4 **)&in_RDI->field_0x8;
  *(undefined1 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = &stack0xfffffffffffffc90;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined1 **)(*(long *)&in_RDI->field_0x8 + 8) = &stack0xfffffffffffffc90;
  Json::Value::Value(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  ValueTest::checkIsEqual
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,uVar1));
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,uVar1));
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,uVar1));
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,uVar1));
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,uVar1));
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffc94,uVar1));
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareArray) {
  // array compare size then content
  Json::Value emptyArray(Json::arrayValue);
  Json::Value l1aArray;
  l1aArray.append(0);
  Json::Value l1bArray;
  l1bArray.append(10);
  Json::Value l2aArray;
  l2aArray.append(0);
  l2aArray.append(0);
  Json::Value l2bArray;
  l2bArray.append(0);
  l2bArray.append(10);
  JSONTEST_ASSERT_PRED(checkIsLess(emptyArray, l1aArray));
  JSONTEST_ASSERT_PRED(checkIsLess(emptyArray, l2aArray));
  JSONTEST_ASSERT_PRED(checkIsLess(l1aArray, l2aArray));
  JSONTEST_ASSERT_PRED(checkIsLess(l2aArray, l2bArray));
  JSONTEST_ASSERT_PRED(checkIsEqual(emptyArray, Json::Value(emptyArray)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l1aArray, Json::Value(l1aArray)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l2bArray, Json::Value(l2bArray)));
}